

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::HMMSegment::InternalCut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  Rune *pRVar1;
  const_iterator pRVar2;
  const_iterator pRVar3;
  reference pvVar4;
  undefined1 local_78 [8];
  WordRange wr;
  size_t i;
  const_iterator right;
  const_iterator left;
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> status;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res_local;
  const_iterator end_local;
  const_iterator begin_local;
  HMMSegment *this_local;
  
  status.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)res;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  Viterbi(this,begin,end,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  wr.right = (const_iterator)0x0;
  right = begin;
  while( true ) {
    pRVar2 = wr.right;
    pRVar3 = (const_iterator)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
    if (pRVar3 <= pRVar2) break;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                        (size_type)wr.right);
    if ((*pvVar4 & 1) != 0) {
      pRVar1 = &(wr.right)->rune;
      WordRange::WordRange((WordRange *)local_78,right,begin + (long)((long)pRVar1 + 1) + -1);
      std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                 status.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(value_type *)local_78);
      right = begin + (long)((long)pRVar1 + 1);
    }
    wr.right = (const_iterator)((long)&(wr.right)->rune + 1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  return;
}

Assistant:

void InternalCut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res) const {
    vector<size_t> status;
    Viterbi(begin, end, status);

    RuneStrArray::const_iterator left = begin;
    RuneStrArray::const_iterator right;
    for (size_t i = 0; i < status.size(); i++) {
      if (status[i] % 2) { //if (HMMModel::E == status[i] || HMMModel::S == status[i])
        right = begin + i + 1;
        WordRange wr(left, right - 1);
        res.push_back(wr);
        left = right;
      }
    }
  }